

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

void __thiscall LZ77Compressor::add(LZ77Compressor *this,uint8_t *bytes,int offset)

{
  iterator __position;
  ulong uVar1;
  int local_4;
  
  uVar1 = (ulong)bytes[(long)offset + 2] << 2 ^
          (ulong)((uint)bytes[(long)offset + 1] * 2) ^ (ulong)bytes[offset];
  __position._M_current =
       this->dict[uVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      this->dict[uVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)(this->dict + uVar1),__position,&local_4);
  }
  else {
    *__position._M_current = offset;
    this->dict[uVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void add(const uint8_t* bytes, int offset) {
		dict[hash(bytes + offset)].push_back(offset);
	}